

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3FkLocateIndex(Parse *pParse,Table *pParent,FKey *pFKey,Index **ppIdx,int **paiCol)

{
  uint uVar1;
  byte *pbVar2;
  Index *pIVar3;
  int *piVar4;
  char **ppcVar5;
  Column *pCVar6;
  byte *pbVar7;
  long lVar8;
  byte bVar9;
  ulong uVar10;
  byte *pbVar11;
  uchar *b;
  char *pcVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  int *local_68;
  
  uVar1 = pFKey->nCol;
  uVar14 = (ulong)uVar1;
  pbVar2 = (byte *)pFKey->aCol[0].zCol;
  if (uVar14 == 1) {
    if (-1 < (long)pParent->iPKey) {
      if (pbVar2 == (byte *)0x0) {
        return 0;
      }
      pbVar7 = (byte *)pParent->aCol[pParent->iPKey].zName;
      bVar9 = *pbVar7;
      pbVar11 = pbVar2;
      if (bVar9 == 0) {
        uVar10 = 0;
      }
      else {
        do {
          pbVar7 = pbVar7 + 1;
          uVar10 = (ulong)bVar9;
          if (""[bVar9] != ""[*pbVar11]) break;
          pbVar11 = pbVar11 + 1;
          bVar9 = *pbVar7;
          uVar10 = 0;
        } while (bVar9 != 0);
      }
      if (""[uVar10] == ""[*pbVar11]) {
        return 0;
      }
    }
  }
  else if (paiCol != (int **)0x0) {
    local_68 = (int *)sqlite3DbMallocRaw(pParse->db,uVar1 * 4);
    if (local_68 == (int *)0x0) {
      return 1;
    }
    *paiCol = local_68;
    goto LAB_0016f046;
  }
  local_68 = (int *)0x0;
LAB_0016f046:
  pIVar3 = pParent->pIndex;
  do {
    if (pIVar3 == (Index *)0x0) {
      if (pParse->disableTriggers == '\0') {
        sqlite3ErrorMsg(pParse,"foreign key mismatch - \"%w\" referencing \"%w\"",
                        pFKey->pFrom->zName,pFKey->zTo);
      }
      sqlite3DbFree(pParse->db,local_68);
      return 1;
    }
    if ((uVar1 == pIVar3->nColumn) && (pIVar3->onError != '\0')) {
      if (pbVar2 == (byte *)0x0) {
        if ((pIVar3->field_0x4f & 3) == 2) {
          if (local_68 != (int *)0x0 && 0 < (int)uVar1) {
            lVar8 = 0;
            do {
              *(int *)((long)local_68 + lVar8) = (&pFKey->aCol[0].iFrom)[lVar8];
              lVar8 = lVar8 + 4;
            } while (uVar14 << 2 != lVar8);
          }
LAB_0016f254:
          *ppIdx = pIVar3;
          return 0;
        }
      }
      else {
        if (0 < (int)uVar1) {
          piVar4 = pIVar3->aiColumn;
          ppcVar5 = pIVar3->azColl;
          pCVar6 = pParent->aCol;
          uVar10 = 0;
LAB_0016f0ae:
          pcVar12 = pCVar6[piVar4[uVar10]].zColl;
          if ((byte *)pcVar12 == (byte *)0x0) {
            pcVar12 = "BINARY";
          }
          pbVar7 = (byte *)ppcVar5[uVar10];
          bVar9 = *pbVar7;
          while (bVar9 != 0) {
            pbVar7 = pbVar7 + 1;
            uVar13 = (ulong)bVar9;
            if (""[uVar13] != ""[(byte)*pcVar12]) goto LAB_0016f104;
            pcVar12 = (char *)((byte *)pcVar12 + 1);
            bVar9 = *pbVar7;
          }
          uVar13 = 0;
LAB_0016f104:
          if (""[uVar13] == ""[(byte)*pcVar12]) {
            uVar13 = 0;
            do {
              pbVar7 = (byte *)pFKey->aCol[uVar13].zCol;
              bVar9 = *pbVar7;
              pbVar11 = (byte *)pCVar6[piVar4[uVar10]].zName;
              while (bVar9 != 0) {
                uVar15 = (ulong)bVar9;
                pbVar7 = pbVar7 + 1;
                if (""[uVar15] != ""[*pbVar11]) goto LAB_0016f162;
                pbVar11 = pbVar11 + 1;
                bVar9 = *pbVar7;
              }
              uVar15 = 0;
LAB_0016f162:
              if (""[uVar15] == ""[*pbVar11]) goto LAB_0016f17a;
              uVar13 = uVar13 + 1;
              if (uVar13 == uVar14) break;
            } while( true );
          }
          goto LAB_0016f1c3;
        }
        uVar10 = 0;
LAB_0016f1c3:
        if ((uint)uVar10 == uVar1) goto LAB_0016f254;
      }
    }
    pIVar3 = pIVar3->pNext;
  } while( true );
LAB_0016f17a:
  if (local_68 != (int *)0x0) {
    local_68[uVar10] = pFKey->aCol[uVar13].iFrom;
  }
  if (uVar1 == (uint)uVar13) goto LAB_0016f1c3;
  uVar10 = uVar10 + 1;
  if (uVar10 == uVar14) goto LAB_0016f254;
  goto LAB_0016f0ae;
}

Assistant:

SQLITE_PRIVATE int sqlite3FkLocateIndex(
  Parse *pParse,                  /* Parse context to store any error in */
  Table *pParent,                 /* Parent table of FK constraint pFKey */
  FKey *pFKey,                    /* Foreign key to find index for */
  Index **ppIdx,                  /* OUT: Unique index on parent table */
  int **paiCol                    /* OUT: Map of index columns in pFKey */
){
  Index *pIdx = 0;                    /* Value to return via *ppIdx */
  int *aiCol = 0;                     /* Value to return via *paiCol */
  int nCol = pFKey->nCol;             /* Number of columns in parent key */
  char *zKey = pFKey->aCol[0].zCol;   /* Name of left-most parent key column */

  /* The caller is responsible for zeroing output parameters. */
  assert( ppIdx && *ppIdx==0 );
  assert( !paiCol || *paiCol==0 );
  assert( pParse );

  /* If this is a non-composite (single column) foreign key, check if it 
  ** maps to the INTEGER PRIMARY KEY of table pParent. If so, leave *ppIdx 
  ** and *paiCol set to zero and return early. 
  **
  ** Otherwise, for a composite foreign key (more than one column), allocate
  ** space for the aiCol array (returned via output parameter *paiCol).
  ** Non-composite foreign keys do not require the aiCol array.
  */
  if( nCol==1 ){
    /* The FK maps to the IPK if any of the following are true:
    **
    **   1) There is an INTEGER PRIMARY KEY column and the FK is implicitly 
    **      mapped to the primary key of table pParent, or
    **   2) The FK is explicitly mapped to a column declared as INTEGER
    **      PRIMARY KEY.
    */
    if( pParent->iPKey>=0 ){
      if( !zKey ) return 0;
      if( !sqlite3StrICmp(pParent->aCol[pParent->iPKey].zName, zKey) ) return 0;
    }
  }else if( paiCol ){
    assert( nCol>1 );
    aiCol = (int *)sqlite3DbMallocRaw(pParse->db, nCol*sizeof(int));
    if( !aiCol ) return 1;
    *paiCol = aiCol;
  }

  for(pIdx=pParent->pIndex; pIdx; pIdx=pIdx->pNext){
    if( pIdx->nColumn==nCol && pIdx->onError!=OE_None ){ 
      /* pIdx is a UNIQUE index (or a PRIMARY KEY) and has the right number
      ** of columns. If each indexed column corresponds to a foreign key
      ** column of pFKey, then this index is a winner.  */

      if( zKey==0 ){
        /* If zKey is NULL, then this foreign key is implicitly mapped to 
        ** the PRIMARY KEY of table pParent. The PRIMARY KEY index may be 
        ** identified by the test (Index.autoIndex==2).  */
        if( pIdx->autoIndex==2 ){
          if( aiCol ){
            int i;
            for(i=0; i<nCol; i++) aiCol[i] = pFKey->aCol[i].iFrom;
          }
          break;
        }
      }else{
        /* If zKey is non-NULL, then this foreign key was declared to
        ** map to an explicit list of columns in table pParent. Check if this
        ** index matches those columns. Also, check that the index uses
        ** the default collation sequences for each column. */
        int i, j;
        for(i=0; i<nCol; i++){
          int iCol = pIdx->aiColumn[i];     /* Index of column in parent tbl */
          char *zDfltColl;                  /* Def. collation for column */
          char *zIdxCol;                    /* Name of indexed column */

          /* If the index uses a collation sequence that is different from
          ** the default collation sequence for the column, this index is
          ** unusable. Bail out early in this case.  */
          zDfltColl = pParent->aCol[iCol].zColl;
          if( !zDfltColl ){
            zDfltColl = "BINARY";
          }
          if( sqlite3StrICmp(pIdx->azColl[i], zDfltColl) ) break;

          zIdxCol = pParent->aCol[iCol].zName;
          for(j=0; j<nCol; j++){
            if( sqlite3StrICmp(pFKey->aCol[j].zCol, zIdxCol)==0 ){
              if( aiCol ) aiCol[i] = pFKey->aCol[j].iFrom;
              break;
            }
          }
          if( j==nCol ) break;
        }
        if( i==nCol ) break;      /* pIdx is usable */
      }
    }
  }

  if( !pIdx ){
    if( !pParse->disableTriggers ){
      sqlite3ErrorMsg(pParse,
           "foreign key mismatch - \"%w\" referencing \"%w\"",
           pFKey->pFrom->zName, pFKey->zTo);
    }
    sqlite3DbFree(pParse->db, aiCol);
    return 1;
  }

  *ppIdx = pIdx;
  return 0;
}